

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGXMLScanner.cpp
# Opt level: O2

EntityExpRes __thiscall
xercesc_4_0::SGXMLScanner::scanEntityRef
          (SGXMLScanner *this,bool param_1,XMLCh *firstCh,XMLCh *secondCh,bool *escaped)

{
  ReaderMgr *this_00;
  XMLBufferMgr *this_01;
  XMLSize_t XVar1;
  ValueHashTableOf<char16_t,_xercesc_4_0::StringHasher> *pVVar2;
  EntityExpRes EVar3;
  bool bVar4;
  XMLBuffer *toFill;
  ulong uVar5;
  char16_t *pcVar6;
  XMLCh *pXVar7;
  XMLCh *text1;
  Codes toEmit;
  XMLBufBid bbName;
  int colonPosition;
  XMLCh expLimStr [32];
  
  *secondCh = L'\0';
  *escaped = false;
  this_00 = &(this->super_XMLScanner).fReaderMgr;
  XVar1 = ((this->super_XMLScanner).fReaderMgr.fCurReader)->fReaderNum;
  bVar4 = ReaderMgr::skippedChar(this_00,L'#');
  if (bVar4) {
    bVar4 = XMLScanner::scanCharRef(&this->super_XMLScanner,firstCh,secondCh);
    if (!bVar4) {
      return EntityExp_Failed;
    }
    *escaped = true;
    if (XVar1 == ((this->super_XMLScanner).fReaderMgr.fCurReader)->fReaderNum) {
      return EntityExp_Returned;
    }
    XMLScanner::emitError(&this->super_XMLScanner,PartialMarkupInEntity);
    return EntityExp_Returned;
  }
  this_01 = &(this->super_XMLScanner).fBufMgr;
  toFill = XMLBufferMgr::bidOnBuffer(this_01);
  bbName.fBuffer = toFill;
  bbName.fMgr = this_01;
  bVar4 = ReaderMgr::getQName(this_00,toFill,&colonPosition);
  if (bVar4) {
    bVar4 = ReaderMgr::skippedChar(this_00,L';');
    if (!bVar4) {
      pXVar7 = (bbName.fBuffer)->fBuffer;
      pXVar7[(bbName.fBuffer)->fIndex] = L'\0';
      XMLScanner::emitError
                (&this->super_XMLScanner,UnterminatedEntityRef,pXVar7,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
    if (XVar1 != ((this->super_XMLScanner).fReaderMgr.fCurReader)->fReaderNum) {
      XMLScanner::emitError(&this->super_XMLScanner,PartialMarkupInEntity);
    }
    pVVar2 = this->fEntityTable;
    pXVar7 = (bbName.fBuffer)->fBuffer;
    pXVar7[(bbName.fBuffer)->fIndex] = L'\0';
    bVar4 = ValueHashTableOf<char16_t,_xercesc_4_0::StringHasher>::containsKey(pVVar2,pXVar7);
    if (bVar4) {
      if ((this->super_XMLScanner).fSecurityManager != (SecurityManager *)0x0) {
        XVar1 = (this->super_XMLScanner).fEntityExpansionLimit;
        uVar5 = (this->super_XMLScanner).fEntityExpansionCount + 1;
        (this->super_XMLScanner).fEntityExpansionCount = uVar5;
        if (XVar1 < uVar5) {
          XMLString::sizeToText(XVar1,expLimStr,0x1f,10,(this->super_XMLScanner).fMemoryManager);
          XMLScanner::emitError
                    (&this->super_XMLScanner,EntityExpansionLimitExceeded,expLimStr,(XMLCh *)0x0,
                     (XMLCh *)0x0,(XMLCh *)0x0);
          (this->super_XMLScanner).fEntityExpansionCount = 0;
        }
      }
      pVVar2 = this->fEntityTable;
      pXVar7 = (bbName.fBuffer)->fBuffer;
      pXVar7[(bbName.fBuffer)->fIndex] = L'\0';
      pcVar6 = ValueHashTableOf<char16_t,_xercesc_4_0::StringHasher>::get
                         (pVVar2,pXVar7,XMLPlatformUtils::fgMemoryManager);
      *firstCh = *pcVar6;
      *escaped = true;
      EVar3 = EntityExp_Returned;
      goto LAB_002b907e;
    }
    if (((this->super_XMLScanner).fStandalone != false) ||
       ((this->super_XMLScanner).fHasNoDTD == true)) {
      text1 = (bbName.fBuffer)->fBuffer;
      pXVar7 = text1 + (bbName.fBuffer)->fIndex;
      toEmit = EntityNotFound;
      goto LAB_002b9059;
    }
  }
  else if (toFill->fIndex == 0) {
    XMLScanner::emitError(&this->super_XMLScanner,ExpectedEntityRefName);
  }
  else {
    text1 = toFill->fBuffer;
    pXVar7 = text1 + toFill->fIndex;
    toEmit = InvalidEntityRefName;
LAB_002b9059:
    *pXVar7 = L'\0';
    XMLScanner::emitError
              (&this->super_XMLScanner,toEmit,text1,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
  }
  EVar3 = EntityExp_Failed;
LAB_002b907e:
  XMLBufBid::~XMLBufBid(&bbName);
  return EVar3;
}

Assistant:

SGXMLScanner::EntityExpRes
SGXMLScanner::scanEntityRef(  const   bool
                            ,       XMLCh&  firstCh
                            ,       XMLCh&  secondCh
                            ,       bool&   escaped)
{
    // Assume no escape
    secondCh = 0;
    escaped = false;

    // We have to insure that its all in one entity
    const XMLSize_t curReader = fReaderMgr.getCurrentReaderNum();

    //  If the next char is a pound, then its a character reference and we
    //  need to expand it always.
    if (fReaderMgr.skippedChar(chPound))
    {
        //  Its a character reference, so scan it and get back the numeric
        //  value it represents.
        if (!scanCharRef(firstCh, secondCh))
            return EntityExp_Failed;

        escaped = true;

        if (curReader != fReaderMgr.getCurrentReaderNum())
            emitError(XMLErrs::PartialMarkupInEntity);

        return EntityExp_Returned;
    }

    // Expand it since its a normal entity ref
    XMLBufBid bbName(&fBufMgr);
    int colonPosition;
    if (!fReaderMgr.getQName(bbName.getBuffer(), &colonPosition))
    {
        if (bbName.isEmpty())
            emitError(XMLErrs::ExpectedEntityRefName);
        else
            emitError(XMLErrs::InvalidEntityRefName, bbName.getRawBuffer());
        return EntityExp_Failed;
    }

    //  Next char must be a semi-colon. But if its not, just emit
    //  an error and try to continue.
    if (!fReaderMgr.skippedChar(chSemiColon))
        emitError(XMLErrs::UnterminatedEntityRef, bbName.getRawBuffer());

    // Make sure we ended up on the same entity reader as the & char
    if (curReader != fReaderMgr.getCurrentReaderNum())
        emitError(XMLErrs::PartialMarkupInEntity);

    // Look up the name in the general entity pool
    // If it does not exist, then obviously an error
    if (!fEntityTable->containsKey(bbName.getRawBuffer()))
    {
        // XML 1.0 Section 4.1
        // Well-formedness Constraint for entity not found:
        //   In a document without any DTD, a document with only an internal DTD subset which contains no parameter entity references,
        //      or a document with "standalone='yes'", for an entity reference that does not occur within the external subset
        //      or a parameter entity
        if (fStandalone || fHasNoDTD)
            emitError(XMLErrs::EntityNotFound, bbName.getRawBuffer());

        return EntityExp_Failed;
    }

    // here's where we need to check if there's a SecurityManager,
    // how many entity references we've had
    if(fSecurityManager != 0 && ++fEntityExpansionCount > fEntityExpansionLimit) {
        XMLCh expLimStr[32];
        XMLString::sizeToText(fEntityExpansionLimit, expLimStr, 31, 10, fMemoryManager);
        emitError
        (
            XMLErrs::EntityExpansionLimitExceeded
            , expLimStr
        );
        // there seems nothing better to be done than to reset the entity expansion limit
        fEntityExpansionCount = 0;
    }

    firstCh = fEntityTable->get(bbName.getRawBuffer());
    escaped = true;
    return EntityExp_Returned;
}